

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  _func_void_Walker_ptr_Select_ptr *p_Var2;
  SrcList *pSVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ushort *puVar8;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar5 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar5 != 0) {
        return uVar5 & 2;
      }
      iVar6 = sqlite3WalkExprList(pWalker,p->pEList);
      if (iVar6 != 0) {
        return 2;
      }
      iVar6 = sqlite3WalkExpr(pWalker,p->pWhere);
      if (iVar6 != 0) {
        return 2;
      }
      iVar6 = sqlite3WalkExprList(pWalker,p->pGroupBy);
      if (iVar6 != 0) {
        return 2;
      }
      iVar6 = sqlite3WalkExpr(pWalker,p->pHaving);
      if (iVar6 != 0) {
        return 2;
      }
      iVar6 = sqlite3WalkExprList(pWalker,p->pOrderBy);
      if (iVar6 != 0) {
        return 2;
      }
      iVar6 = sqlite3WalkExpr(pWalker,p->pLimit);
      if (iVar6 != 0) {
        return 2;
      }
      if (p->pWinDefn == (Window *)0x0) goto LAB_00174ae1;
      p_Var2 = pWalker->xSelectCallback2;
      if (p_Var2 == sqlite3WalkWinDefnDummyCallback) {
LAB_00174ad3:
        iVar6 = walkWindowList(pWalker,p->pWinDefn,0);
        if (iVar6 != 0) {
          return 2;
        }
      }
      else if (pWalker->pParse == (Parse *)0x0) {
        if (p_Var2 == sqlite3SelectPopWith) goto LAB_00174ad3;
      }
      else if ((p_Var2 == sqlite3SelectPopWith) || (1 < pWalker->pParse->eParseMode))
      goto LAB_00174ad3;
LAB_00174ae1:
      pSVar3 = p->pSrc;
      if (pSVar3 != (SrcList *)0x0) {
        puVar8 = (ushort *)&pSVar3->a[0].fg.field_0x1;
        for (iVar6 = pSVar3->nSrc; 0 < iVar6; iVar6 = iVar6 + -1) {
          uVar4 = *puVar8;
          if ((uVar4 & 4) != 0) {
            iVar7 = sqlite3WalkSelect(pWalker,(Select *)**(undefined8 **)((long)puVar8 + 0x27));
            if (iVar7 != 0) {
              return 2;
            }
            uVar4 = *puVar8;
          }
          if (((uVar4 & 8) != 0) &&
             (iVar7 = sqlite3WalkExprList(pWalker,*(ExprList **)((long)puVar8 + 0xf)), iVar7 != 0))
          {
            return 2;
          }
          puVar8 = puVar8 + 0x24;
        }
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}